

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void Network_Controller(int playernum,bool add)

{
  bool bVar1;
  char *pcVar2;
  bool add_local;
  int playernum_local;
  
  if (consoleplayer == Net_Arbitrator) {
    if ((((&DAT_00d635f1)[(long)playernum * 0x2a0] & 1) == 0) || (!add)) {
      if ((((&DAT_00d635f1)[(long)playernum * 0x2a0] & 1) != 0) || (add)) {
        if ((playeringame[playernum] & 1U) == 0) {
          Printf("Player (%d) not found!\n",(ulong)(uint)playernum);
        }
        else {
          bVar1 = TObjPtr<DBot>::operator!=
                            ((TObjPtr<DBot> *)(&DAT_00d635f8 + (long)playernum * 0x2a0),(DBot *)0x0)
          ;
          if (bVar1) {
            Printf("Bots cannot be added to the controller list.\n");
          }
          else if (playernum == Net_Arbitrator) {
            Printf("The net arbitrator cannot have their status changed on this list.\n");
          }
          else {
            if (add) {
              Net_WriteByte('0');
            }
            else {
              Net_WriteByte('1');
            }
            Net_WriteByte((BYTE)playernum);
          }
        }
      }
      else {
        pcVar2 = userinfo_t::GetName((userinfo_t *)((long)playernum * 0x2a0 + 0xd63498));
        Printf("%s is not on the setting controller list.\n",pcVar2);
      }
    }
    else {
      pcVar2 = userinfo_t::GetName((userinfo_t *)((long)playernum * 0x2a0 + 0xd63498));
      Printf("%s is already on the setting controller list.\n",pcVar2);
    }
  }
  else {
    Printf("This command is only accessible to the net arbitrator.\n");
  }
  return;
}

Assistant:

static void Network_Controller (int playernum, bool add)
{
	if (consoleplayer != Net_Arbitrator)
	{
		Printf ("This command is only accessible to the net arbitrator.\n");
		return;
	}

	if (players[playernum].settings_controller && add)
	{
		Printf ("%s is already on the setting controller list.\n", players[playernum].userinfo.GetName());
		return;
	}

	if (!players[playernum].settings_controller && !add)
	{
		Printf ("%s is not on the setting controller list.\n", players[playernum].userinfo.GetName());
		return;
	}

	if (!playeringame[playernum])
	{
		Printf ("Player (%d) not found!\n", playernum);
		return;
	}

	if (players[playernum].Bot != NULL)
	{
		Printf ("Bots cannot be added to the controller list.\n");
		return;
	}

	if (playernum == Net_Arbitrator)
	{
		Printf ("The net arbitrator cannot have their status changed on this list.\n");
		return;
	}

	if (add)
		Net_WriteByte (DEM_ADDCONTROLLER);
	else
		Net_WriteByte (DEM_DELCONTROLLER);

	Net_WriteByte (playernum);
}